

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

int __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::DynamicStringPair>::clone
          (Property<Protocol::MQTT::Common::DynamicStringPair> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  uint8 uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  DynamicStringPair local_60;
  
  puVar2 = (undefined8 *)operator_new(0x48);
  uVar1 = (this->super_PropertyBase).type;
  local_60.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_0011f688;
  local_60.key.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_0011f3e8;
  local_60.key.length = *(uint16 *)&this->field_0x29;
  uVar3 = (ulong)local_60.key.length;
  local_60.key.data = (char *)malloc(uVar3);
  memcpy(local_60.key.data,*(void **)&this->field_0x2b,uVar3);
  local_60.value.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_0011f3e8;
  local_60.value.length = *(uint16 *)&this->field_0x3b;
  uVar3 = (ulong)local_60.value.length;
  local_60.value.data = (char *)malloc(uVar3);
  memcpy(local_60.value.data,*(void **)&this->field_0x3d,uVar3);
  *(uint8 *)(puVar2 + 1) = uVar1;
  puVar2[2] = 0;
  *(undefined1 *)(puVar2 + 3) = 1;
  *puVar2 = &PTR_getSize_0011f6d8;
  Common::DynamicStringPair::DynamicStringPair((DynamicStringPair *)((long)puVar2 + 0x19),&local_60)
  ;
  free(local_60.value.data);
  local_60.value.length = 0;
  free(local_60.key.data);
  return (int)puVar2;
}

Assistant:

PropertyBase * clone() const { return new Property((PropertyType)type, value, true); }